

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_brdf.h
# Opt level: O2

value_type __thiscall djb::fresnel::schlick::zero_value(schlick *this)

{
  float *extraout_RDX;
  long in_RSI;
  value_type vVar1;
  float local_c;
  
  local_c = 0.0;
  std::valarray<float>::valarray((valarray<float> *)this,&local_c,*(size_t *)(in_RSI + 8));
  vVar1._M_data = extraout_RDX;
  vVar1._M_size = (size_t)this;
  return vVar1;
}

Assistant:

const brdf::value_type zero_value() const {
			return brdf::value_type(float_t(0), f0.size());
		}